

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O1

Value * cmDumpCTestInfo(Value *__return_storage_ptr__,cmake *cm)

{
  cmLocalGenerator *lg;
  cmTest *this;
  pointer pcVar1;
  pointer pbVar2;
  pointer ppVar3;
  bool bVar4;
  Value *pVVar5;
  pointer ppcVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  cmake *cm_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmd;
  pointer pbVar9;
  pointer value;
  string *local_398;
  _Rb_tree_node_base *local_390;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_value;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  ValueHolder local_370;
  undefined8 local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  vector<cmTest_*,_std::allocator<cmTest_*>_> tests_1;
  string command;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  cmListFileBacktrace local_2d8;
  string *local_2c8;
  _Rb_tree_node_base *local_2c0;
  cmake *local_2b8;
  _Base_ptr local_2b0;
  _Base_ptr local_2a8;
  pointer local_2a0;
  pointer local_298;
  Value local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  Value entry;
  Value local_210;
  Value local_1e8;
  Value tests;
  Value pObj;
  Value properties;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_210,arrayValue);
  (anonymous_namespace)::getConfigurations_abi_cxx11_(&local_268,(_anonymous_namespace_ *)cm,cm_00);
  local_398 = local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c8 = local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2b8 = cm;
    do {
      Json::Value::Value(&local_148,objectValue);
      Json::Value::Value(&local_80,local_398);
      pVVar5 = Json::Value::operator[](&local_148,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_1e8,arrayValue);
      local_390 = (cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
      local_2c0 = &(cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (local_390 != local_2c0) {
        do {
          Json::Value::Value(&pObj,objectValue);
          Json::Value::Value(&local_f8,(string *)(local_390 + 1));
          pVVar5 = Json::Value::operator[](&pObj,&kNAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::Value(&tests,arrayValue);
          p_Var8 = *(_Base_ptr *)(local_390 + 2);
          local_2b0 = local_390[2]._M_parent;
          if (p_Var8 != local_2b0) {
            do {
              cmLocalGenerator::GenerateTestFiles(*(cmLocalGenerator **)p_Var8);
              lg = *(cmLocalGenerator **)p_Var8;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2a8 = p_Var8;
              cmMakefile::GetTests(lg->Makefile,local_398,&tests_1);
              local_2a0 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              ppcVar6 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                do {
                  this = *ppcVar6;
                  local_298 = ppcVar6;
                  Json::Value::Value(&local_290,objectValue);
                  pcVar1 = (this->Name)._M_dataplus._M_p;
                  local_370.string_ = (char *)&local_360;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_370,pcVar1,pcVar1 + (this->Name)._M_string_length);
                  Json::Value::Value(&local_a8,(string *)&local_370);
                  pVVar5 = Json::Value::operator[](&local_290,&kCTEST_NAME_abi_cxx11_);
                  Json::Value::operator=(pVVar5,&local_a8);
                  Json::Value::~Value(&local_a8);
                  if (local_370 != &local_360) {
                    operator_delete(local_370.string_,
                                    CONCAT71(local_360._M_allocated_capacity._1_7_,
                                             local_360._M_local_buf[0]) + 1);
                  }
                  command._M_dataplus._M_p = (pointer)&command.field_2;
                  command._M_string_length = 0;
                  command.field_2._M_local_buf[0] = '\0';
                  pbVar2 = (this->Command).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar9 = (this->Command).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
                      pbVar9 = pbVar9 + 1) {
                    std::__cxx11::string::_M_append
                              ((char *)&command,(ulong)(pbVar9->_M_dataplus)._M_p);
                    std::__cxx11::string::append((char *)&command);
                  }
                  local_2d8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_2d8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_2d8);
                  if (local_2d8.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2d8.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
                  local_368 = 0;
                  local_360._M_local_buf[0] = '\0';
                  local_370.string_ = (char *)&local_360;
                  psVar7 = cmCompiledGeneratorExpression::Evaluate
                                     ((cmCompiledGeneratorExpression *)
                                      cge._M_t.
                                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                      ._M_head_impl,lg,local_398,false,(cmGeneratorTarget *)0x0,
                                      (cmGeneratorTarget *)0x0,
                                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_370);
                  if (local_370 != &local_360) {
                    operator_delete(local_370.string_,
                                    CONCAT71(local_360._M_allocated_capacity._1_7_,
                                             local_360._M_local_buf[0]) + 1);
                  }
                  Json::Value::Value((Value *)&local_370,psVar7);
                  pVVar5 = Json::Value::operator[](&local_290,&kCTEST_COMMAND_abi_cxx11_);
                  Json::Value::operator=(pVVar5,(Value *)&local_370);
                  Json::Value::~Value((Value *)&local_370);
                  Json::Value::Value(&properties,arrayValue);
                  cmPropertyMap::GetList_abi_cxx11_(&local_250,&this->Properties);
                  ppVar3 = local_250.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (value = local_250.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; value != ppVar3;
                      value = value + 1) {
                    Json::Value::Value(&entry,objectValue);
                    Json::Value::Value(&local_d0,&value->first);
                    pVVar5 = Json::Value::operator[](&entry,&kKEY_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar5,&local_d0);
                    Json::Value::~Value(&local_d0);
                    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge_value,(string *)&ge);
                    local_2f8._8_8_ = 0;
                    local_2e8._M_local_buf[0] = '\0';
                    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
                    psVar7 = cmCompiledGeneratorExpression::Evaluate
                                       ((cmCompiledGeneratorExpression *)
                                        cge_value._M_t.
                                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                        .
                                        super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                        ._M_head_impl,lg,local_398,false,(cmGeneratorTarget *)0x0,
                                        (cmGeneratorTarget *)0x0,
                                        (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_2f8)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_allocated_capacity != &local_2e8) {
                      operator_delete((void *)local_2f8._M_allocated_capacity,
                                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,
                                               local_2e8._M_local_buf[0]) + 1);
                    }
                    Json::Value::Value(&local_58,psVar7);
                    pVVar5 = Json::Value::operator[](&entry,&kVALUE_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar5,&local_58);
                    Json::Value::~Value(&local_58);
                    Json::Value::append(&properties,&entry);
                    std::
                    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ::~unique_ptr(&cge_value);
                    Json::Value::~Value(&entry);
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_250);
                  Json::Value::Value(&entry,&properties);
                  pVVar5 = Json::Value::operator[](&local_290,&kPROPERTIES_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar5,&entry);
                  Json::Value::~Value(&entry);
                  Json::Value::~Value(&properties);
                  std::
                  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ::~unique_ptr(&cge);
                  cmGeneratorExpression::~cmGeneratorExpression(&ge);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)command._M_dataplus._M_p != &command.field_2) {
                    operator_delete(command._M_dataplus._M_p,
                                    CONCAT71(command.field_2._M_allocated_capacity._1_7_,
                                             command.field_2._M_local_buf[0]) + 1);
                  }
                  bVar4 = Json::Value::isNull(&local_290);
                  if (!bVar4) {
                    Json::Value::append(&tests,&local_290);
                  }
                  Json::Value::~Value(&local_290);
                  ppcVar6 = local_298 + 1;
                } while (ppcVar6 != local_2a0);
              }
              if (tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)tests_1.
                                      super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)tests_1.
                                      super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              p_Var8 = (_Base_ptr)&local_2a8->_M_parent;
              cm = local_2b8;
            } while (p_Var8 != local_2b0);
          }
          Json::Value::Value(&local_120,&tests);
          pVVar5 = Json::Value::operator[](&pObj,&kCTEST_INFO_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_120);
          Json::Value::~Value(&local_120);
          Json::Value::append(&local_1e8,&pObj);
          Json::Value::~Value(&tests);
          Json::Value::~Value(&pObj);
          local_390 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_390);
        } while (local_390 != local_2c0);
      }
      pVVar5 = Json::Value::operator[](&local_148,&kPROJECTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_1e8);
      Json::Value::~Value(&local_1e8);
      Json::Value::append(&local_210,&local_148);
      Json::Value::~Value(&local_148);
      local_398 = local_398 + 1;
    } while (local_398 != local_2c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar5,&local_210);
  Json::Value::~Value(&local_210);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmDumpCTestInfo(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpCTestConfigurationsList(cm);
  return result;
}